

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

string * duckdb::Exception::ConstructMessageRecursive<long,unsigned_short,unsigned_short>
                   (string *msg,
                   vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                   *values,long param,unsigned_short params,unsigned_short params_1)

{
  string *in_RDI;
  undefined4 in_R8D;
  value_type *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  unsigned_short in_stack_ffffffffffffffac;
  unsigned_short in_stack_ffffffffffffffae;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
  *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  
  ExceptionFormatValue::CreateFormatValue<long>((long)in_stack_ffffffffffffff48);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  push_back((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
            CONCAT44(in_R8D,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48);
  ExceptionFormatValue::~ExceptionFormatValue((ExceptionFormatValue *)0xccd71a);
  ConstructMessageRecursive<unsigned_short,unsigned_short>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffae,
             in_stack_ffffffffffffffac);
  return in_RDI;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}